

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall
t_js_generator::t_js_generator
          (t_js_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  _Rb_tree_node_base *__rhs;
  string *psVar1;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  invalid_argument *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  t_oop_generator::t_oop_generator(&this->super_t_oop_generator,program);
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_js_generator_003679e0;
  (this->ts_module_)._M_dataplus._M_p = (pointer)&(this->ts_module_).field_2;
  (this->ts_module_)._M_string_length = 0;
  (this->ts_module_).field_2._M_local_buf[0] = '\0';
  (this->imports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->imports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->imports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->module_name_2_import_path)._M_h._M_buckets =
       &(this->module_name_2_import_path)._M_h._M_single_bucket;
  (this->module_name_2_import_path)._M_h._M_bucket_count = 1;
  (this->module_name_2_import_path)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->module_name_2_import_path)._M_h._M_element_count = 0;
  (this->module_name_2_import_path)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->module_name_2_import_path)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->module_name_2_import_path)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->include_2_import_name)._M_h._M_buckets =
       &(this->include_2_import_name)._M_h._M_single_bucket;
  (this->include_2_import_name)._M_h._M_bucket_count = 1;
  (this->include_2_import_name)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->include_2_import_name)._M_h._M_element_count = 0;
  (this->include_2_import_name)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->include_2_import_name)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->include_2_import_name)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->thrift_package_output_directory_)._M_dataplus._M_p =
       (pointer)&(this->thrift_package_output_directory_).field_2;
  (this->thrift_package_output_directory_)._M_string_length = 0;
  (this->thrift_package_output_directory_).field_2._M_local_buf[0] = '\0';
  (this->js_const_type_)._M_dataplus._M_p = (pointer)&(this->js_const_type_).field_2;
  (this->js_const_type_)._M_string_length = 0;
  (this->js_const_type_).field_2._M_local_buf[0] = '\0';
  (this->js_let_type_)._M_dataplus._M_p = (pointer)&(this->js_let_type_).field_2;
  (this->js_let_type_)._M_string_length = 0;
  (this->js_let_type_).field_2._M_local_buf[0] = '\0';
  (this->js_var_type_)._M_dataplus._M_p = (pointer)&(this->js_var_type_).field_2;
  (this->js_var_type_)._M_string_length = 0;
  (this->js_var_type_).field_2._M_local_buf[0] = '\0';
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_episode_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_ts_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_ts_);
  this->gen_node_ = false;
  this->gen_jquery_ = false;
  this->gen_ts_ = false;
  this->gen_es6_ = false;
  this->gen_episode_file_ = false;
  bVar2 = false;
  for (p_Var4 = (parsed_options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(parsed_options->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    __rhs = p_Var4 + 1;
    iVar3 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar3 == 0) {
      this->gen_node_ = true;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar3 == 0) {
        this->gen_jquery_ = true;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar3 == 0) {
          this->gen_ts_ = true;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar3 == 0) {
            bVar2 = true;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar3 == 0) {
              this->gen_es6_ = true;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar3 == 0) {
                parse_imports(this,program,(string *)(p_Var4 + 2));
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)__rhs);
                if (iVar3 != 0) {
                  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::operator+(&local_50,"unknown option js:",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
                  std::invalid_argument::invalid_argument(piVar6,(string *)&local_50);
                  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                parse_thrift_package_output_directory(this,(string *)(p_Var4 + 2));
              }
            }
          }
        }
      }
    }
  }
  if ((this->gen_es6_ == true) && (this->gen_jquery_ == true)) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar6,"invalid switch: [-gen js:es6,jquery] options not compatible");
  }
  else if (this->gen_node_ == true) {
    if (this->gen_jquery_ != true) {
LAB_00236b5f:
      std::__cxx11::string::assign((char *)&this->js_const_type_);
      std::__cxx11::string::assign((char *)&this->js_let_type_);
      std::__cxx11::string::assign((char *)&this->js_var_type_);
      if (this->gen_es6_ == true) {
        std::__cxx11::string::assign((char *)&this->js_const_type_);
        std::__cxx11::string::assign((char *)&this->js_let_type_);
      }
      psVar1 = &(this->super_t_oop_generator).super_t_generator.out_dir_base_;
      if (this->gen_node_ == true) {
        std::__cxx11::string::assign((char *)psVar1);
        this->no_ns_ = (bool)(~bVar2 & 1);
      }
      else {
        std::__cxx11::string::assign((char *)psVar1);
        this->no_ns_ = false;
      }
      local_50._M_dataplus._M_p._0_1_ = 0x27;
      pmVar5 = std::
               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&(this->super_t_oop_generator).super_t_generator.escape_,
                            (key_type_conflict *)&local_50);
      std::__cxx11::string::assign((char *)pmVar5);
      return;
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar6,
               "invalid switch: [-gen js:node,jquery] options not compatible, try: [-gen js:node -gen js:jquery]"
              );
  }
  else {
    if (!bVar2) goto LAB_00236b5f;
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar6,"invalid switch: [-gen js:with_ns] is only valid when using node.js");
  }
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

t_js_generator(t_program* program,
                 const std::map<std::string, std::string>& parsed_options,
                 const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    gen_node_ = false;
    gen_jquery_ = false;
    gen_ts_ = false;
    gen_es6_ = false;
    gen_episode_file_ = false;

    bool with_ns_ = false;

    for (iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("node") == 0) {
        gen_node_ = true;
      } else if( iter->first.compare("jquery") == 0) {
        gen_jquery_ = true;
      } else if( iter->first.compare("ts") == 0) {
        gen_ts_ = true;
      } else if( iter->first.compare("with_ns") == 0) {
        with_ns_ = true;
      } else if( iter->first.compare("es6") == 0) {
        gen_es6_ = true;
      } else if( iter->first.compare("imports") == 0) {
        parse_imports(program, iter->second);
      } else if (iter->first.compare("thrift_package_output_directory") == 0) {
        parse_thrift_package_output_directory(iter->second);
      } else {
        throw std::invalid_argument("unknown option js:" + iter->first);
      }
    }

    if (gen_es6_ && gen_jquery_) {
      throw std::invalid_argument("invalid switch: [-gen js:es6,jquery] options not compatible");
    }

    if (gen_node_ && gen_jquery_) {
      throw std::invalid_argument("invalid switch: [-gen js:node,jquery] options not compatible, try: [-gen js:node -gen "
            "js:jquery]");
    }

    if (!gen_node_ && with_ns_) {
      throw std::invalid_argument("invalid switch: [-gen js:with_ns] is only valid when using node.js");
    }

    // Depending on the processing flags, we will update these to be ES6 compatible
    js_const_type_ = "var ";
    js_let_type_ = "var ";
    js_var_type_ = "var ";
    if (gen_es6_) {
      js_const_type_ = "const ";
      js_let_type_ = "let ";
    }

    if (gen_node_) {
      out_dir_base_ = "gen-nodejs";
      no_ns_ = !with_ns_;
    } else {
      out_dir_base_ = "gen-js";
      no_ns_ = false;
    }

    escape_['\''] = "\\'";
  }